

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_number_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  uint32_t *puVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  gc_heap_ptr_untyped *this;
  long *plVar5;
  undefined1 local_160 [16];
  slot *local_150;
  gc_heap_ptr_untyped local_148;
  gc_heap_ptr_untyped local_138;
  gc_heap *local_128;
  gc_heap_ptr_untyped local_120;
  gc_heap_ptr_untyped local_110;
  undefined1 local_100 [8];
  undefined1 local_f8 [32];
  value p;
  gc_heap_ptr_untyped local_a8;
  gc_heap_ptr<mjs::number_object> prototype;
  gc_heap_ptr<mjs::function_object> c;
  string_view local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  gc_heap_ptr_untyped local_40;
  
  local_128 = (global->super_gc_heap_ptr_untyped).heap_;
  local_100 = (undefined1  [8])0x6;
  local_f8._0_8_ = "Number";
  string::string((string *)&p,local_128,(string_view *)local_100);
  local_150 = (slot *)global;
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(local_160,plVar2);
  local_138.heap_ = (gc_heap *)0x0;
  gc_heap::make<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,double>
            ((gc_heap *)&prototype,(string *)local_128,(gc_heap_ptr<mjs::object> *)&p,
             (double *)local_160);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
  object::class_name((object *)local_160);
  make_raw_function((mjs *)&c,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  local_100 = (undefined1  [8])0x0;
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8840;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&p,(gc_heap_ptr<mjs::gc_string> *)local_160,
             (gc_heap_ptr<mjs::gc_string> *)local_100,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&prototype.super_gc_heap_ptr_untyped);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8880;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),&local_110);
  function_object::construct_function(pfVar3,(gc_heap_ptr<mjs::gc_function> *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  function_object::get_prototype(&p,pfVar3);
  if (p.type_ == object) {
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_150->allocation);
    if (*(int *)((long)pvVar4 + 0x20) < 1) {
      this = &value::object_value(&p)->super_gc_heap_ptr_untyped;
      plVar2 = (long *)gc_heap_ptr_untyped::get(this);
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_150->allocation);
      (**(code **)(*plVar5 + 0x98))(local_160,plVar5,"constructor");
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_138,&c.super_gc_heap_ptr_untyped);
      value::value((value *)local_100,(object_ptr *)&local_138);
      (**(code **)(*plVar2 + 8))(plVar2,local_160,local_100,2);
      value::~value((value *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
    }
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_150->allocation);
    (**(code **)(*plVar5 + 0x98))(local_100,plVar5,"constructor");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)local_160,&c.super_gc_heap_ptr_untyped);
    value::value(&p,(object_ptr *)local_160);
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
    local_160._0_8_ = (gc_heap *)0x9;
    local_160._8_8_ = "MAX_VALUE";
    string::string((string *)local_100,local_128,(string_view *)local_160);
    p.type_ = number;
    p.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)0x7fefffffffffffff;
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,7);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
    local_160._0_8_ = (gc_heap *)0x9;
    local_160._8_8_ = "MIN_VALUE";
    string::string((string *)local_100,local_128,(string_view *)local_160);
    p.type_ = number;
    p.field_1.n_ = 4.94065645841247e-324;
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,7);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
    local_160._0_8_ = (gc_heap *)0x3;
    local_160._8_8_ = "NaN";
    string::string((string *)local_100,local_128,(string_view *)local_160);
    p.type_ = number;
    p.field_1.n_ = NAN;
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,7);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
    local_160._0_8_ = (gc_heap *)0x11;
    local_160._8_8_ = "NEGATIVE_INFINITY";
    string::string((string *)local_100,local_128,(string_view *)local_160);
    p.type_ = number;
    p.field_1.n_ = -INFINITY;
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,7);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
    local_160._0_8_ = (gc_heap *)0x11;
    local_160._8_8_ = "POSITIVE_INFINITY";
    string::string((string *)local_100,local_128,(string_view *)local_160);
    p.type_ = number;
    p.field_1.n_ = INFINITY;
    (**(code **)(*plVar2 + 8))(plVar2,local_100,&p,7);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
    local_70._M_len = 8;
    local_70._M_str = "toString";
    string::string((string *)&local_120,local_128,&local_70);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)local_100,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_f8 + 8),(gc_heap_ptr_untyped *)&local_150->allocation);
    local_f8._24_8_ = local_128;
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
    make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
    local_138.heap_ = (gc_heap *)0x0;
    local_138.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c86c0;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),(gc_heap_ptr_untyped *)(local_f8 + 8));
    *(undefined8 *)((long)pvVar4 + 0x30) = local_f8._24_8_;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138,1
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
    value::value(&p,(object_ptr *)&local_110);
    (**(code **)(*plVar2 + 8))(plVar2,&local_120,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}::
    ~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
             *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
    local_70._M_len = 7;
    local_70._M_str = "valueOf";
    string::string((string *)&local_120,local_128,&local_70);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)local_100,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_f8 + 8),(gc_heap_ptr_untyped *)&local_150->allocation);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
    make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
    local_138.heap_ = (gc_heap *)0x0;
    local_138.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8700;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),(gc_heap_ptr_untyped *)(local_f8 + 8));
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138,0
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
    value::value(&p,(object_ptr *)&local_110);
    (**(code **)(*plVar2 + 8))(plVar2,&local_120,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}::
    ~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
             *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_150->allocation);
    if (0 < *(int *)((long)pvVar4 + 0x20)) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
      local_70._M_len = 0xe;
      local_70._M_str = "toLocaleString";
      string::string((string *)&local_120,local_128,&local_70);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)local_100,&prototype.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)(local_f8 + 8),(gc_heap_ptr_untyped *)&local_150->allocation
                );
      local_f8._24_8_ = local_128;
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
      make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation)
      ;
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
      local_138.heap_ = (gc_heap *)0x0;
      local_138.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8740;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)local_100);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),(gc_heap_ptr_untyped *)(local_f8 + 8))
      ;
      *(undefined8 *)((long)pvVar4 + 0x30) = local_f8._24_8_;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138
                 ,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
      value::value(&p,(object_ptr *)&local_110);
      (**(code **)(*plVar2 + 8))(plVar2,&local_120,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}
      ::~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
                 *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&local_40,(gc_heap_ptr_untyped *)&local_150->allocation);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
      local_70._M_len = 7;
      local_70._M_str = "toFixed";
      string::string((string *)&local_120,local_128,&local_70);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&p,&prototype.super_gc_heap_ptr_untyped);
      puVar1 = &p.field_1.o_.super_gc_heap_ptr_untyped.pos_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)puVar1,(gc_heap_ptr_untyped *)&local_150->allocation);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)
                 &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,&local_40);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
      make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation)
      ;
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
      local_138.heap_ = (gc_heap *)0x0;
      local_138.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8780;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)&p);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),(gc_heap_ptr_untyped *)puVar1);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x30),
                 (gc_heap_ptr_untyped *)
                 &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138
                 ,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
      value::value((value *)local_100,(object_ptr *)&local_110);
      (**(code **)(*plVar2 + 8))(plVar2,&local_120,local_100,2);
      value::~value((value *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}
      ::~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
                 *)&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&local_50,(gc_heap_ptr_untyped *)&local_150->allocation);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
      local_70._M_len = 0xd;
      local_70._M_str = "toExponential";
      string::string((string *)&local_120,local_128,&local_70);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&p,&prototype.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&p.field_1.o_.super_gc_heap_ptr_untyped.pos_,
                 (gc_heap_ptr_untyped *)&local_150->allocation);
      puVar1 = &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)puVar1,&local_50);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
      make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation)
      ;
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
      local_138.heap_ = (gc_heap *)0x0;
      local_138.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c87c0;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)&p);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),
                 (gc_heap_ptr_untyped *)&p.field_1.o_.super_gc_heap_ptr_untyped.pos_);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x30),(gc_heap_ptr_untyped *)puVar1);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138
                 ,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
      value::value((value *)local_100,(object_ptr *)&local_110);
      (**(code **)(*plVar2 + 8))(plVar2,&local_120,local_100,2);
      value::~value((value *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}
      ::~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
                 *)&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&local_60,(gc_heap_ptr_untyped *)&local_150->allocation);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&prototype.super_gc_heap_ptr_untyped);
      local_70._M_len = 0xb;
      local_70._M_str = "toPrecision";
      string::string((string *)&local_120,local_128,&local_70);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&p,&prototype.super_gc_heap_ptr_untyped);
      puVar1 = &p.field_1.o_.super_gc_heap_ptr_untyped.pos_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)puVar1,(gc_heap_ptr_untyped *)&local_150->allocation);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)
                 &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,&local_60);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_a8);
      make_raw_function((mjs *)&local_148,(gc_heap_ptr<mjs::global_object> *)&local_150->allocation)
      ;
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_148);
      local_138.heap_ = (gc_heap *)0x0;
      local_138.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_160,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_160);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c8800;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)&p);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x20),(gc_heap_ptr_untyped *)puVar1);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x30),
                 (gc_heap_ptr_untyped *)
                 &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_138
                 ,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,&local_148);
      value::value((value *)local_100,(object_ptr *)&local_110);
      (**(code **)(*plVar2 + 8))(plVar2,&local_120,local_100,2);
      value::~value((value *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      const::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}
      ::~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
                 *)&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
    }
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)__return_storage_ptr__,&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_object.cpp:53:35)]"
               );
}

Assistant:

global_object_create_result make_number_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<number_object>(string{h, "Number"}, global->object_prototype(), 0.);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{args.empty() ? 0.0 : to_number(args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_number(prototype, args.empty() ? 0.0 : to_number(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    c->put(string{h, "MAX_VALUE"}, value{1.7976931348623157e308}, global_object::prototype_attributes);
    c->put(string{h, "MIN_VALUE"}, value{5e-324}, global_object::prototype_attributes);
    c->put(string{h, "NaN"}, value{NAN}, global_object::prototype_attributes);
    c->put(string{h, "NEGATIVE_INFINITY"}, value{-INFINITY}, global_object::prototype_attributes);
    c->put(string{h, "POSITIVE_INFINITY"}, value{INFINITY}, global_object::prototype_attributes);

    auto make_number_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [prototype, global, f](const value& this_, const std::vector<value>& args){
            if (this_.type() == value_type::number) {
                return value{f(this_.number_value(), args)};
            }
            global->validate_type(this_, prototype, "Number");
            return value{f(static_cast<const number_object&>(*this_.object_value()).number_value(), args)};
        }, num_args);
    };


    make_number_function("toString", 1, [&h](double num, const std::vector<value>& args) {
        const int radix = args.empty() ? 10 : to_int32(args.front());
        if (radix < 2 || radix > 36) {
            std::wostringstream woss;
            woss << "Invalid radix in Number.toString: " << to_string(h, args.front());
            THROW_RUNTIME_ERROR(woss.str());
        }
        if (radix != 10) {
            return string{h, number_to_radix_string(num, radix)};
        }
        return to_string(h, num);
    });
    make_number_function("valueOf", 0, [](double num, const std::vector<value>&) {
        return num;
    });

    if (global->language_version() >= version::es3) {
        make_number_function("toLocaleString", 0, [&h](double num, const std::vector<value>&) {
            return to_string(h, num);
        });
        make_number_function("toFixed", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toFixed()"};
            }
            auto& h = global.heap();
            if (std::isnan(num) || std::fabs(num) >= 1e21) {
                return to_string(h, num);
            }
            return string{h, number_to_fixed(num, f)};
        });
        make_number_function("toExponential", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toExponential()"};
            }
            auto& h = global.heap();
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_exponential(num, f)};
        });
        make_number_function("toPrecision", 1, [global](double num, const std::vector<value>& args) {
            auto& h = global.heap();
            if (args.empty()) {
                return to_string(h, num);
            }
            const auto p = get_int_arg(args);
            if (p < 1 || p > 21) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"precision out of range in Number.toPrecision()"};
            }
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_precision(num, p)};
        });
    }

    return { c, prototype };
}